

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-lite-ecc.c
# Opt level: O0

int ndn_ecdsa_verify(uint8_t *input_value,uint32_t input_size,uint8_t *sig_value,uint32_t sig_size,
                    ndn_ecc_pub_t *ecc_pub_key)

{
  int iVar1;
  uint8_t local_58 [8];
  uint8_t hash_result [32];
  ndn_ecc_pub_t *ecc_pub_key_local;
  uint32_t sig_size_local;
  uint8_t *sig_value_local;
  uint32_t input_size_local;
  uint8_t *input_value_local;
  
  hash_result._24_8_ = ecc_pub_key;
  memset(local_58,0,0x20);
  iVar1 = ndn_sha256(input_value,input_size,local_58);
  if (iVar1 == 0) {
    input_value_local._4_4_ =
         (*ndn_ecc_backend.ecdsa_verify)
                   (local_58,0x20,sig_value,sig_size,(abstract_ecc_pub_key_t *)hash_result._24_8_,
                    *(uint8_t *)(hash_result._24_8_ + 0x48));
  }
  else {
    input_value_local._4_4_ = -0x19;
  }
  return input_value_local._4_4_;
}

Assistant:

int
ndn_ecdsa_verify(const uint8_t* input_value, uint32_t input_size,
                 const uint8_t* sig_value, uint32_t sig_size,
                 const ndn_ecc_pub_t* ecc_pub_key)
{
  uint8_t hash_result[NDN_SEC_SHA256_HASH_SIZE] = {0};
  if (ndn_sha256(input_value, input_size, hash_result) != NDN_SUCCESS)
    return NDN_SEC_CRYPTO_ALGO_FAILURE;

  return ndn_ecc_backend.ecdsa_verify(hash_result, sizeof(hash_result),
                                      sig_value, sig_size,
                                      &ecc_pub_key->abs_key, ecc_pub_key->curve_type);
}